

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.h
# Opt level: O0

bool __thiscall bvh_node::hit(bvh_node *this,ray *r,interval ray_t,hit_record *rec)

{
  hit_record *phVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  bool local_a1;
  double local_a0;
  interval local_78;
  bvh_node *pbStack_60;
  bool hit_right;
  double local_58;
  byte local_49;
  bvh_node *pbStack_48;
  bool hit_left;
  double local_40;
  hit_record *local_38;
  hit_record *rec_local;
  ray *r_local;
  bvh_node *this_local;
  interval ray_t_local;
  
  local_40 = ray_t.max;
  pbStack_48 = (bvh_node *)ray_t.min;
  local_38 = rec;
  rec_local = (hit_record *)r;
  r_local = (ray *)this;
  this_local = pbStack_48;
  ray_t_local.min = local_40;
  bVar2 = aabb::hit(&this->bbox,r,ray_t);
  if (bVar2) {
    peVar4 = std::__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->left);
    pbStack_60 = this_local;
    local_58 = ray_t_local.min;
    iVar3 = (*peVar4->_vptr_hittable[2])(this_local,ray_t_local.min,peVar4,rec_local,local_38);
    local_49 = (byte)iVar3 & 1;
    peVar4 = std::__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->right);
    phVar1 = rec_local;
    if ((local_49 & 1) == 0) {
      local_a0 = ray_t_local.min;
    }
    else {
      local_a0 = local_38->t;
    }
    interval::interval(&local_78,(double)this_local,local_a0);
    iVar3 = (*peVar4->_vptr_hittable[2])(local_78.min,local_78.max,peVar4,phVar1,local_38);
    local_a1 = true;
    if ((local_49 & 1) == 0) {
      local_a1 = (bool)((byte)iVar3 & 1);
    }
    ray_t_local.max._7_1_ = local_a1;
  }
  else {
    ray_t_local.max._7_1_ = false;
  }
  return ray_t_local.max._7_1_;
}

Assistant:

bool hit(const ray& r, interval ray_t, hit_record& rec) const override {
        if (!bbox.hit(r, ray_t))
            return false;

        bool hit_left = left->hit(r, ray_t, rec);
        bool hit_right = right->hit(r, interval(ray_t.min, hit_left ? rec.t : ray_t.max), rec);

        return hit_left || hit_right;
    }